

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4s.c
# Opt level: O0

int decompressBlock(roslz4_stream *str)

{
  void *pvVar1;
  XXH_errorcode XVar2;
  int nbytes;
  roslz4_stream *in_RDI;
  int ret_1;
  int decomp_size;
  int ret;
  stream_state *state;
  int in_stack_00000054;
  void *in_stack_00000058;
  void *in_stack_00000060;
  int local_4;
  
  pvVar1 = in_RDI->state;
  if ((*(int *)((long)pvVar1 + 0x44) == 4) &&
     (*(int *)((long)pvVar1 + 0x40) == *(int *)((long)pvVar1 + 0x1c))) {
    if (*(int *)((long)pvVar1 + 0x48) == 0) {
      nbytes = LZ4_decompress_safe((char *)str,(char *)state,ret,decomp_size);
      if (nbytes < 0) {
        if (in_RDI->output_left < *(int *)((long)pvVar1 + 0x18)) {
          local_4 = -2;
        }
        else {
          local_4 = -3;
        }
      }
      else {
        XVar2 = XXH32_update(in_stack_00000060,in_stack_00000058,in_stack_00000054);
        if (XVar2 == XXH_ERROR) {
          local_4 = -1;
        }
        else {
          advanceOutput(in_RDI,nbytes);
          *(undefined4 *)((long)pvVar1 + 0x44) = 0;
          *(undefined4 *)((long)pvVar1 + 0x1c) = 0;
          local_4 = 0;
        }
      }
    }
    else if ((uint)in_RDI->output_left < *(uint *)((long)pvVar1 + 0x40)) {
      local_4 = -2;
    }
    else {
      memcpy(in_RDI->output_next,*(void **)((long)pvVar1 + 0x10),
             (ulong)*(uint *)((long)pvVar1 + 0x40));
      XVar2 = XXH32_update(in_stack_00000060,in_stack_00000058,in_stack_00000054);
      if (XVar2 == XXH_ERROR) {
        local_4 = -1;
      }
      else {
        advanceOutput(in_RDI,*(int *)((long)pvVar1 + 0x40));
        *(undefined4 *)((long)pvVar1 + 0x44) = 0;
        *(undefined4 *)((long)pvVar1 + 0x1c) = 0;
        local_4 = 0;
      }
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int decompressBlock(roslz4_stream *str) {
  stream_state *state = str->state;
  if (state->block_size_read != 4 || state->block_size != state->buffer_offset) {
    // Internal error: Can't decompress block, it's not in buffer
    return ROSLZ4_ERROR;
  }

  if (state->block_uncompressed) {
    if (str->output_left >= state->block_size) {
      memcpy(str->output_next, state->buffer, state->block_size);
      int ret = XXH32_update(state->xxh32_state, str->output_next,
                             state->block_size);
      if (ret == XXH_ERROR) { return ROSLZ4_ERROR; }
      advanceOutput(str, state->block_size);
      state->block_size_read = 0;
      state->buffer_offset = 0;
      return ROSLZ4_OK;
    } else {
      return ROSLZ4_OUTPUT_SMALL;
    }
  } else {
    int decomp_size;
    decomp_size = LZ4_decompress_safe(state->buffer, str->output_next,
                                      state->block_size, str->output_left);
    if (decomp_size < 0) {
      if (str->output_left >= state->buffer_size) {
        return ROSLZ4_DATA_ERROR; // Must be a problem with the data stream
      } else {
        // Data error or output is small; increase output to disambiguate
        return ROSLZ4_OUTPUT_SMALL;
      }
    } else {
      int ret = XXH32_update(state->xxh32_state, str->output_next, decomp_size);
      if (ret == XXH_ERROR) { return ROSLZ4_ERROR; }
      advanceOutput(str, decomp_size);
      state->block_size_read = 0;
      state->buffer_offset = 0;
      return ROSLZ4_OK;
    }
  }
}